

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAdvancedBlendTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BlendEquationIndexedStateCase::iterate
          (BlendEquationIndexedStateCase *this)

{
  TestLog *pTVar1;
  bool bVar2;
  ContextType ctxType;
  int iVar3;
  GLenum err;
  undefined4 extraout_var;
  long *plVar4;
  NotSupportedError *this_00;
  size_type *psVar5;
  long lVar6;
  ScopedLogSection section;
  CallLogWrapper gl;
  ResultCollector result;
  string local_288;
  ScopedLogSection local_268;
  string local_260;
  long *local_240 [2];
  long local_230 [2];
  CallLogWrapper local_220;
  Enum<int,_2UL> local_208;
  ResultCollector local_1f8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar2) {
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_KHR_blend_equation_advanced");
    if (bVar2) {
      bVar2 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_EXT_draw_buffers_indexed");
      if (bVar2) goto LAB_0159a6d0;
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"GL_EXT_draw_buffers_indexed is not supported",
                 "m_context.getContextInfo().isExtensionSupported(\"GL_EXT_draw_buffers_indexed\")",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAdvancedBlendTests.cpp"
                 ,0x2d1);
    }
    else {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"GL_KHR_blend_equation_advanced is not supported",
                 "m_context.getContextInfo().isExtensionSupported(\"GL_KHR_blend_equation_advanced\")"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAdvancedBlendTests.cpp"
                 ,0x2d0);
    }
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
LAB_0159a6d0:
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_220,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_1f8,pTVar1,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  local_220.m_enableLog = true;
  if (0 < this->m_numEquations) {
    lVar6 = 0;
    do {
      pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Type","");
      local_208.m_value = this->m_equations[lVar6];
      local_208.m_getName = glu::getBlendEquationName;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      tcu::Format::Enum<int,_2UL>::toStream(&local_208,(ostream *)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_240,0,(char *)0x0,0x1ba3f67);
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_288.field_2._M_allocated_capacity = *psVar5;
        local_288.field_2._8_8_ = plVar4[3];
      }
      else {
        local_288.field_2._M_allocated_capacity = *psVar5;
        local_288._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_288._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      tcu::ScopedLogSection::ScopedLogSection(&local_268,pTVar1,&local_260,&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if (local_240[0] != local_230) {
        operator_delete(local_240[0],local_230[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      glu::CallLogWrapper::glBlendEquationi(&local_220,2,this->m_equations[lVar6]);
      err = glu::CallLogWrapper::glGetError(&local_220);
      glu::checkError(err,"glBlendEquationi",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAdvancedBlendTests.cpp"
                      ,0x2de);
      deqp::gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_1f8,&local_220,0x8009,2,this->m_equations[lVar6],this->m_type);
      tcu::TestLog::endSection(local_268.m_log);
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->m_numEquations);
  }
  tcu::ResultCollector::setTestContextResult
            (&local_1f8,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_220);
  return STOP;
}

Assistant:

BlendEquationIndexedStateCase::IterateResult BlendEquationIndexedStateCase::iterate (void)
{
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		TCU_CHECK_AND_THROW(NotSupportedError, m_context.getContextInfo().isExtensionSupported("GL_KHR_blend_equation_advanced"), "GL_KHR_blend_equation_advanced is not supported");
		TCU_CHECK_AND_THROW(NotSupportedError, m_context.getContextInfo().isExtensionSupported("GL_EXT_draw_buffers_indexed"), "GL_EXT_draw_buffers_indexed is not supported");
	}

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	for (int ndx = 0; ndx < m_numEquations; ++ndx)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Type", "Test " + de::toString(glu::getBlendEquationStr(m_equations[ndx])));

		gl.glBlendEquationi(2, m_equations[ndx]);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "glBlendEquationi");

		gls::StateQueryUtil::verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION, 2, m_equations[ndx], m_type);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}